

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::parse(Reader *this,string *document,Value *root,bool collectComments)

{
  bool bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  char *beginDoc;
  long lVar2;
  char *end;
  char *begin;
  bool collectComments_local;
  Value *root_local;
  string *document_local;
  Reader *this_local;
  
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  std::__cxx11::string::assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)&this->document_,__first,__last);
  beginDoc = (char *)std::__cxx11::string::c_str();
  lVar2 = std::__cxx11::string::length();
  bVar1 = parse(this,beginDoc,beginDoc + lVar2,root,collectComments);
  return bVar1;
}

Assistant:

bool Reader::parse(const std::string& document, Value& root,
                   bool collectComments) {
  document_.assign(document.begin(), document.end());
  const char* begin = document_.c_str();
  const char* end = begin + document_.length();
  return parse(begin, end, root, collectComments);
}